

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

char RDL_checkGraphConnected(RDL_graph *gra)

{
  char *visited_00;
  char local_21;
  char result;
  char *visited;
  uint i;
  RDL_graph *gra_local;
  
  local_21 = '\x01';
  visited_00 = (char *)malloc((ulong)gra->V);
  *visited_00 = '\x01';
  for (visited._4_4_ = 1; visited._4_4_ < gra->V; visited._4_4_ = visited._4_4_ + 1) {
    visited_00[visited._4_4_] = '\0';
  }
  RDL_DFSvisit(gra,0,visited_00);
  visited._4_4_ = 0;
  do {
    if (gra->V <= visited._4_4_) {
LAB_0010a5b8:
      free(visited_00);
      return local_21;
    }
    if (visited_00[visited._4_4_] == '\0') {
      local_21 = '\0';
      goto LAB_0010a5b8;
    }
    visited._4_4_ = visited._4_4_ + 1;
  } while( true );
}

Assistant:

char RDL_checkGraphConnected(const RDL_graph *gra)
{
  unsigned i;
  char *visited;
  char result;
  result = 1;
  visited = malloc(gra->V * sizeof(*visited));
  visited[0] = 1; /*start vertex*/
  for(i=1; i<gra->V; ++i)
  {
    visited[i] = 0; /*unvisited*/
  }
  RDL_DFSvisit(gra, 0, visited);
  for(i=0; i<gra->V; ++i)
  {
    if(visited[i] == 0) /*one was unvisited*/
    {
      result = 0;
      break;
    }
  }

  free(visited);
  return result;
}